

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O2

void __thiscall helics::FilterInfo::~FilterInfo(FilterInfo *this)

{
  std::__cxx11::string::~string((string *)&this->destEpts);
  std::__cxx11::string::~string((string *)&this->sourceEpts);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (&this->destEndpoints);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::~vector
            (&this->sourceEndpoints);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->filterOp).
              super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~_Vector_base
            (&(this->destTargets).
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>);
  std::_Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~_Vector_base
            (&(this->sourceTargets).
              super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>);
  std::__cxx11::string::~string((string *)&this->outputType);
  std::__cxx11::string::~string((string *)&this->inputType);
  std::__cxx11::string::~string((string *)&this->key);
  return;
}

Assistant:

FilterInfo(GlobalBrokerId core_id_,
               InterfaceHandle handle_,
               std::string_view key_,
               std::string_view type_in_,
               std::string_view type_out_,
               bool destFilter_):
        core_id(core_id_), handle(handle_), key(key_), inputType(type_in_), outputType(type_out_),
        dest_filter(destFilter_)
    {
    }